

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::remove
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,char *__filename)

{
  bool bVar1;
  char *in_RDX;
  char *dst;
  size_t newLength;
  size_t oldLength;
  bool result;
  char *local_58;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffb0;
  char *local_8;
  
  if (in_RDX == (char *)0x0) {
    local_8 = (char *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  }
  else {
    local_8 = (char *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
    if (__filename < local_8) {
      if (__filename == (char *)0x0) {
        if (in_RDX < local_8) {
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
               in_RDX + (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
                              m_p;
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length =
               (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length -
               (long)in_RDX;
          local_8 = (char *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
                            m_length;
        }
        else {
          clear(in_stack_ffffffffffffffb0);
          local_8 = (char *)0x0;
        }
      }
      else if ((in_RDX == (char *)0xffffffffffffffff) || (local_8 <= __filename + (long)in_RDX)) {
        bVar1 = overrideLength(this,(size_t)in_stack_ffffffffffffffb0);
        local_8 = __filename;
        if (!bVar1) {
          local_8 = (char *)0xffffffffffffffff;
        }
      }
      else {
        bVar1 = ensureExclusive(in_stack_ffffffffffffffb0);
        if (bVar1) {
          local_58 = local_8 + -(long)in_RDX;
          StringDetailsImpl<char>::copy
                    ((EVP_PKEY_CTX *)
                     (__filename +
                     (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p)
                     ,(EVP_PKEY_CTX *)
                      (__filename +
                      (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p
                      ) + (long)in_RDX);
          bVar1 = overrideLength(this,(size_t)in_stack_ffffffffffffffb0);
          if (!bVar1) {
            local_58 = (char *)0xffffffffffffffff;
          }
          local_8 = local_58;
        }
        else {
          local_8 = (char *)0xffffffffffffffff;
        }
      }
    }
  }
  return (int)local_8;
}

Assistant:

size_t
	remove(
		size_t index,
		size_t count = 1
	) {
		bool result;

		if (count == 0)
			return this->m_length;

		size_t oldLength = this->m_length;
		if (index >= oldLength)
			return oldLength;
		else if (index == 0)
			if (count >= oldLength) {
				clear();
				return 0;
			} else {
				this->m_p += count;
				this->m_length -= count;
				return this->m_length;
			}

		if (count == -1 || index + count >= oldLength) {
			result = overrideLength(index);
			return result ? index : -1;
		}

		result = ensureExclusive();
		if (!result)
			return -1;

		size_t newLength = oldLength - count;

		T* dst = this->m_p + index;
		Details::copy(dst, dst + count, newLength - index);

		result = overrideLength(newLength);
		return result ? newLength : -1;
	}